

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O1

void anon_unknown.dwarf_2fa662::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int w,int h,int xs,int ys,int dx,int dy)

{
  float fVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  _Alloc_hider __filename;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ostream *poVar13;
  Compression *pCVar14;
  undefined4 *puVar15;
  char *pcVar16;
  int *piVar17;
  void *pvVar18;
  void *pvVar19;
  void *pvVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  float *pfVar23;
  float *pfVar24;
  _Rb_tree_node_base *p_Var25;
  _Rb_tree_node_base *p_Var26;
  _Rb_tree_node_base *p_Var27;
  void *pvVar28;
  half *phVar29;
  char *pcVar30;
  char *pcVar31;
  undefined4 uVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  long lVar38;
  void *pvVar39;
  char *pcVar40;
  uint uVar41;
  void *pvVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  ulong uVar48;
  long lVar49;
  char *pcVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  Compression local_22c;
  long local_228;
  char *local_200;
  int local_1f0;
  FrameBuffer fb;
  void *local_1a0;
  int local_180;
  long local_170;
  void *local_168;
  Header hdr;
  Array2D<Imath_3_2::half> ph4;
  long local_c0;
  string filename;
  TiledOutputFile out;
  int iStack_94;
  undefined8 uStack_90;
  TiledInputFile in;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)&filename);
  lVar11 = (long)-h;
  lVar12 = (long)-w;
  local_22c = NO_COMPRESSION;
  do {
    __filename._M_p = filename._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar13 = (ostream *)std::ostream::operator<<(&std::cout,local_22c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,":",1);
    std::ostream::flush();
    _out = 0;
    ph4._sizeX = 0;
    fb._map._M_t._M_impl._0_4_ = w;
    fb._map._M_t._M_impl._4_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = w + 0xaa;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = h + 0x3a;
    Imf_3_2::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph4,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pCVar14 = (Compression *)Imf_3_2::Header::compression();
    *pCVar14 = local_22c;
    puVar15 = (undefined4 *)Imf_3_2::Header::lineOrder();
    *puVar15 = 0;
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,UINT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1ca1d1);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1ca1d4);
    pcVar16 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar16,(Channel *)0x1ca1d7);
    _out = 0xf0000000f;
    uStack_90 = 0;
    Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)(pi->_data + pi->_sizeY * lVar11 + lVar12),4,0x2ac,1,1,0.0
               ,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d1);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)(ph->_data + ph->_sizeY * lVar11 + lVar12),2,0x156,1,1,0.0
               ,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)(pf->_data + pf->_sizeY * lVar11 + lVar12),4,0x2ac,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
    std::ostream::flush();
    remove(__filename._M_p);
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile(&out,__filename._M_p,&hdr,iVar7);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
    iVar9 = (int)(Channel *)&out;
    iVar7 = Imf_3_2::TiledOutputFile::numXTiles(iVar9);
    iVar8 = Imf_3_2::TiledOutputFile::numYTiles(iVar9);
    Imf_3_2::TiledOutputFile::writeTiles(iVar9,0,iVar7 + -1,0,iVar8 + -1);
    Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (whole file)",0x16);
    std::ostream::flush();
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile(&in,__filename._M_p,iVar7);
    Imf_3_2::TiledInputFile::header();
    piVar17 = (int *)Imf_3_2::Header::dataWindow();
    iVar7 = piVar17[2];
    lVar46 = (long)*piVar17;
    uVar43 = (iVar7 - lVar46) + 1;
    iVar8 = piVar17[1];
    lVar33 = (long)piVar17[3] - (long)iVar8;
    uVar37 = lVar33 + 1;
    uVar48 = uVar37 * uVar43;
    uVar36 = -(ulong)(uVar48 >> 0x3e != 0) | uVar48 * 4;
    pvVar18 = operator_new__(uVar36);
    uVar44 = uVar48 * 2;
    if ((long)uVar48 < 0) {
      uVar44 = 0xffffffffffffffff;
    }
    pvVar19 = operator_new__(uVar44);
    pvVar20 = operator_new__(uVar36);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar38 = -(long)iVar8 * uVar43;
    uVar44 = uVar43 * 4;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)((long)pvVar18 + lVar46 * -4 + lVar38 * 4),4,uVar44,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d1);
    uVar36 = uVar43 * 2;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pvVar19 + lVar46 * -2 + lVar38 * 2),2,uVar36,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)((long)pvVar20 + lVar46 * -4 + lVar38 * 4),4,uVar44,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d7);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
    iVar60 = (int)&in;
    iVar8 = Imf_3_2::TiledInputFile::numXTiles(iVar60);
    iVar9 = Imf_3_2::TiledInputFile::numYTiles(iVar60);
    uVar32 = 0;
    Imf_3_2::TiledInputFile::readTiles(iVar60,0,iVar8 + -1,0,iVar9 + -1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", comparing (whole file)",0x18);
    std::ostream::flush();
    Imf_3_2::TiledInputFile::header();
    puVar21 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar22 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar8 = -(uint)((int)*puVar22 == (int)*puVar21);
    iVar9 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
    auVar52._4_4_ = iVar8;
    auVar52._0_4_ = iVar8;
    auVar52._8_4_ = iVar9;
    auVar52._12_4_ = iVar9;
    iVar8 = movmskpd(uVar32,auVar52);
    if ((iVar8 != 3) ||
       (iVar9 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
       iVar60 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
       auVar53._4_4_ = iVar9, auVar53._0_4_ = iVar9, auVar53._8_4_ = iVar60, auVar53._12_4_ = iVar60
       , iVar9 = movmskpd((int)puVar22,auVar53), iVar9 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10a,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    puVar21 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar22 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar9 = -(uint)((int)*puVar22 == (int)*puVar21);
    iVar60 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
    auVar54._4_4_ = iVar9;
    auVar54._0_4_ = iVar9;
    auVar54._8_4_ = iVar60;
    auVar54._12_4_ = iVar60;
    iVar8 = movmskpd(iVar8,auVar54);
    if ((iVar8 != 3) ||
       (iVar8 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
       iVar9 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
       auVar55._4_4_ = iVar8, auVar55._0_4_ = iVar8, auVar55._8_4_ = iVar9, auVar55._12_4_ = iVar9,
       iVar8 = movmskpd((int)puVar22,auVar55), iVar8 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar23;
    pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar23) || (NAN(fVar1) || NAN(*pfVar23))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar24 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar23 != *pfVar24) || (NAN(*pfVar23) || NAN(*pfVar24))) || (pfVar23[1] != pfVar24[1]))
       || (NAN(pfVar23[1]) || NAN(pfVar24[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10e,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar23;
    pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar23) || (NAN(fVar1) || NAN(*pfVar23))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10f,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    iVar8 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar8 != *piVar17) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x110,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar17 = (int *)Imf_3_2::Header::compression();
    iVar8 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::compression();
    if (iVar8 != *piVar17) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x111,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var26 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var27 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var25 == p_Var27) break;
      iVar8 = strcmp((char *)(p_Var25 + 1),(char *)(p_Var26 + 1));
      if (iVar8 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x118,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var25[9]._M_color != p_Var26[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x119,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var25[9].field_0x4 != *(int *)&p_Var26[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var25[9]._M_parent != *(int *)&p_Var26[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var26 != p_Var25) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x121,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    uVar48 = uVar37 & 0xffffffff;
    local_180 = (int)lVar33;
    local_1f0 = (int)(iVar7 - lVar46);
    if ((PXR24_COMPRESSION < local_22c) && (-1 < local_180)) {
      local_c0 = 0;
      local_170 = 0;
      local_168 = pvVar19;
      do {
        uVar10 = (uint)uVar37;
        uVar35 = 0xf;
        if ((int)uVar10 < 0xf) {
          uVar35 = uVar10;
        }
        if ((int)uVar35 < 2) {
          uVar35 = 1;
        }
        if (-1 < local_1f0) {
          lVar33 = uVar48 - local_170;
          iVar8 = (int)lVar33;
          iVar7 = 0xf;
          if (iVar8 < 0xf) {
            iVar7 = iVar8;
          }
          lVar46 = (long)iVar7;
          lVar47 = 0;
          local_1a0 = local_168;
          uVar37 = uVar43 & 0xffffffff;
          lVar38 = 0;
          do {
            uVar41 = (uint)uVar37;
            lVar49 = 0xf;
            if ((long)(int)uVar41 < 0xf) {
              lVar49 = (long)(int)uVar41;
            }
            uVar51 = 0xf;
            if ((int)uVar41 < 0xf) {
              uVar51 = uVar41;
            }
            if ((int)uVar51 < 2) {
              uVar51 = 1;
            }
            iVar9 = (int)(uVar43 - lVar38);
            iVar8 = 0xf;
            if (iVar9 < 0xf) {
              iVar8 = iVar9;
            }
            uStack_90 = (long)iVar8;
            uVar37 = uStack_90 * lVar46 * 2;
            if (uStack_90 * lVar46 < 0) {
              uVar37 = 0xffffffffffffffff;
            }
            _out = lVar46;
            pvVar28 = operator_new__(uVar37);
            ph4._sizeX = lVar46;
            ph4._sizeY = uStack_90;
            ph4._data = (half *)operator_new__(uVar37);
            if (0 < lVar33) {
              lVar3 = ph->_sizeY;
              lVar34 = (long)&ph->_data->_h + local_c0 * lVar3 + lVar47;
              uVar37 = 0;
              phVar29 = ph4._data;
              pvVar39 = pvVar28;
              pvVar42 = local_1a0;
              do {
                if (0 < (long)(uVar43 - lVar38)) {
                  uVar45 = 0;
                  do {
                    *(undefined2 *)((long)pvVar39 + uVar45 * 2) =
                         *(undefined2 *)(lVar34 + uVar45 * 2);
                    phVar29[uVar45]._h = *(uint16_t *)((long)pvVar42 + uVar45 * 2);
                    uVar45 = uVar45 + 1;
                  } while (uVar51 != uVar45);
                }
                uVar37 = uVar37 + 1;
                phVar29 = phVar29 + lVar49;
                pvVar39 = (void *)((long)pvVar39 + lVar49 * 2);
                pvVar42 = (void *)((long)pvVar42 + uVar36);
                lVar34 = lVar34 + lVar3 * 2;
              } while (uVar37 != uVar35);
            }
            if ((local_22c & (DWAA_COMPRESSION|B44_COMPRESSION)) == B44_COMPRESSION) {
              compareB44(iVar8,iVar7,(Array2D<Imath_3_2::half> *)&out,&ph4);
            }
            if (ph4._data != (half *)0x0) {
              operator_delete__(ph4._data);
            }
            if (pvVar28 != (void *)0x0) {
              operator_delete__(pvVar28);
            }
            lVar38 = lVar38 + 0xf;
            uVar37 = (ulong)(uVar41 - 0xf);
            local_1a0 = (void *)((long)local_1a0 + 0x1e);
            lVar47 = lVar47 + 0x1e;
          } while ((int)lVar38 <= local_1f0);
        }
        local_170 = local_170 + 0xf;
        uVar37 = (ulong)(uVar10 - 0xf);
        local_168 = (void *)((long)local_168 + uVar43 * 0x1e);
        local_c0 = local_c0 + 0x1e;
      } while ((int)local_170 <= local_180);
    }
    if (-1 < local_180) {
      lVar33 = 0;
      local_228 = 0;
      uVar37 = 0;
      pvVar28 = pvVar19;
      pvVar39 = pvVar20;
      pvVar42 = pvVar18;
      do {
        if (-1 < local_1f0) {
          uVar45 = 0;
          do {
            if (*(int *)((long)pi->_data + uVar45 * 4 + pi->_sizeY * lVar33) !=
                *(int *)((long)pvVar42 + uVar45 * 4)) {
              __assert_fail("pi1[y][x] == pi2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14a,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            if ((local_22c < B44_COMPRESSION) &&
               ((fVar1 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(uint16_t *)
                                           ((long)&ph->_data[uVar45]._h + ph->_sizeY * local_228) *
                                   4),
                pfVar23 = (float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)((long)pvVar28 + uVar45 * 2) * 4),
                fVar1 != *pfVar23 || (NAN(fVar1) || NAN(*pfVar23))))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14f,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            bVar6 = equivalent(*(float *)((long)pf->_data + uVar45 * 4 + pf->_sizeY * lVar33),
                               *(float *)((long)pvVar39 + uVar45 * 4),local_22c);
            if (!bVar6) {
              __assert_fail("equivalent (pf1[y][x], pf2[y][x], comp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x152,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            uVar45 = uVar45 + 1;
          } while ((uVar43 & 0xffffffff) != uVar45);
        }
        uVar37 = uVar37 + 1;
        pvVar28 = (void *)((long)pvVar28 + uVar36);
        local_228 = local_228 + 2;
        pvVar39 = (void *)((long)pvVar39 + uVar44);
        lVar33 = lVar33 + 4;
        pvVar42 = (void *)((long)pvVar42 + uVar44);
      } while (uVar37 != uVar48);
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    operator_delete__(pvVar20);
    operator_delete__(pvVar19);
    operator_delete__(pvVar18);
    Imf_3_2::TiledInputFile::~TiledInputFile(&in);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading and comparing (tile-by-tile)",0x26);
    std::ostream::flush();
    iVar7 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph4,__filename._M_p,iVar7);
    pcVar16 = (char *)operator_new__(900);
    pcVar30 = (char *)operator_new__(0x1c2);
    pcVar31 = (char *)operator_new__(900);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice((Slice *)&out,UINT,pcVar16,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d1);
    Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar30,2,0x1e,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d4);
    uVar32 = 4;
    Imf_3_2::Slice::Slice((Slice *)&out,FLOAT,pcVar31,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca1d7);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph4);
    Imf_3_2::TiledInputFile::header();
    puVar21 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar22 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar7 = -(uint)((int)*puVar22 == (int)*puVar21);
    iVar8 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
    auVar56._4_4_ = iVar7;
    auVar56._0_4_ = iVar7;
    auVar56._8_4_ = iVar8;
    auVar56._12_4_ = iVar8;
    iVar7 = movmskpd(uVar32,auVar56);
    if ((iVar7 != 3) ||
       (iVar8 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
       iVar9 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
       auVar57._4_4_ = iVar8, auVar57._0_4_ = iVar8, auVar57._8_4_ = iVar9, auVar57._12_4_ = iVar9,
       iVar8 = movmskpd((int)puVar22,auVar57), iVar8 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    puVar21 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar22 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar8 = -(uint)((int)*puVar22 == (int)*puVar21);
    iVar9 = -(uint)((int)((ulong)*puVar22 >> 0x20) == (int)((ulong)*puVar21 >> 0x20));
    auVar58._4_4_ = iVar8;
    auVar58._0_4_ = iVar8;
    auVar58._8_4_ = iVar9;
    auVar58._12_4_ = iVar9;
    iVar7 = movmskpd(iVar7,auVar58);
    if ((iVar7 != 3) ||
       (iVar7 = -(uint)((int)puVar22[1] == (int)puVar21[1]),
       iVar8 = -(uint)((int)((ulong)puVar22[1] >> 0x20) == (int)((ulong)puVar21[1] >> 0x20)),
       auVar59._4_4_ = iVar7, auVar59._0_4_ = iVar7, auVar59._8_4_ = iVar8, auVar59._12_4_ = iVar8,
       iVar7 = movmskpd((int)puVar22,auVar59), iVar7 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar23;
    pfVar23 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar23) || (NAN(fVar1) || NAN(*pfVar23))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar24 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar23 != *pfVar24) || (NAN(*pfVar23) || NAN(*pfVar24))) || (pfVar23[1] != pfVar24[1]))
       || (NAN(pfVar23[1]) || NAN(pfVar24[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,399,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar23;
    pfVar23 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar23) || (NAN(fVar1) || NAN(*pfVar23))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,400,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    iVar7 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar7 != *piVar17) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x191,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar17 = (int *)Imf_3_2::Header::compression();
    iVar7 = *piVar17;
    piVar17 = (int *)Imf_3_2::Header::compression();
    if (iVar7 != *piVar17) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x192,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var26 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var27 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var25 == p_Var27) break;
      iVar7 = strcmp((char *)(p_Var25 + 1),(char *)(p_Var26 + 1));
      if (iVar7 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x199,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var25[9]._M_color != p_Var26[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var25[9].field_0x4 != *(int *)&p_Var26[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var25[9]._M_parent != *(int *)&p_Var26[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var25 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var25);
      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var25 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var26 != p_Var25) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x1a2,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    iVar7 = 0;
    while( true ) {
      iVar8 = Imf_3_2::TiledInputFile::numYTiles((int)&ph4);
      if (iVar8 <= iVar7) break;
      iVar8 = 0;
      while( true ) {
        iVar60 = (int)&ph4;
        iVar9 = Imf_3_2::TiledInputFile::numXTiles(iVar60);
        if (iVar9 <= iVar8) break;
        Imf_3_2::TiledInputFile::readTile(iVar60,iVar8,iVar7);
        Imf_3_2::TiledInputFile::dataWindowForTile((int)&out,iVar60,iVar8);
        if (iStack_94 <= uStack_90._4_4_) {
          iVar60 = _out - w;
          local_228 = (long)(iStack_94 - h) * 2;
          lVar46 = (long)(iStack_94 - h) << 2;
          lVar33 = (long)iVar60 * 4;
          uVar43 = 0;
          pcVar40 = pcVar31;
          pcVar50 = pcVar16;
          iVar9 = iStack_94;
          local_200 = pcVar30;
          do {
            iVar5 = _out;
            if (_out <= (int)uStack_90) {
              uVar37 = 0;
              do {
                if (*(int *)((long)pi->_data + uVar37 * 4 + lVar33 + pi->_sizeY * lVar46) !=
                    *(int *)(pcVar50 + uVar37 * 4)) {
                  __assert_fail("pi1[oY + y][oX + x] == pi2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1b6,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                if ((local_22c < B44_COMPRESSION) &&
                   ((fVar1 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(uint16_t *)
                                               ((long)&ph->_data[(long)iVar60 + uVar37]._h +
                                               ph->_sizeY * local_228) * 4),
                    pfVar23 = (float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(local_200 + uVar37 * 2) * 4),
                    fVar1 != *pfVar23 || (NAN(fVar1) || NAN(*pfVar23))))) {
                  __assert_fail("ph1[oY + y][oX + x] == ph2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1bd,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                bVar6 = equivalent(*(float *)((long)pf->_data +
                                             uVar37 * 4 + lVar33 + pf->_sizeY * lVar46),
                                   *(float *)(pcVar40 + uVar37 * 4),local_22c);
                if (!bVar6) {
                  __assert_fail("equivalent (pf1[oY + y][oX + x], pf2[y][x], comp)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1c1,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
              } while ((uVar37 < 0xe) &&
                      (iVar4 = (int)uVar37, uVar37 = uVar37 + 1, iVar5 + iVar4 < (int)uStack_90));
            }
            if (0xd < uVar43) break;
            uVar43 = uVar43 + 1;
            local_200 = local_200 + 0x1e;
            pcVar40 = pcVar40 + 0x3c;
            pcVar50 = pcVar50 + 0x3c;
            local_228 = local_228 + 2;
            lVar46 = lVar46 + 4;
            bVar6 = iVar9 < uStack_90._4_4_;
            iVar9 = iVar9 + 1;
          } while (bVar6);
        }
        iVar8 = iVar8 + 1;
      }
      iVar7 = iVar7 + 1;
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    operator_delete__(pcVar31);
    operator_delete__(pcVar30);
    operator_delete__(pcVar16);
    Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph4);
    remove(__filename._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    Imf_3_2::Header::~Header(&hdr);
    local_22c = local_22c + RLE_COMPRESSION;
    if (local_22c == NUM_COMPRESSION_METHODS) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          w,
    int                          h,
    int                          xs,
    int                          ys,
    int                          dx,
    int                          dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeRead (
            pi,
            ph,
            pf,
            filename.c_str (),
            LineOrder (0),
            w,
            h,
            xs,
            ys,
            dx,
            dy,
            Compression (comp));
    }
}